

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

char * absl::StackString(void **pcs,int n,char *buf,int maxlen,bool symbolize)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  int local_100;
  int local_fc;
  int i;
  int len;
  char sym [200];
  bool symbolize_local;
  int maxlen_local;
  char *buf_local;
  int n_local;
  void **pcs_local;
  
  local_fc = 0;
  for (local_100 = 0; local_100 != n; local_100 = local_100 + 1) {
    if (symbolize) {
      bVar1 = base_internal::AtomicHook<bool(*)(void_const*,char*,int)>::operator()
                        ((AtomicHook<bool(*)(void_const*,char*,int)> *)
                         (anonymous_namespace)::symbolizer,pcs + local_100,(char (*) [200])&i,
                         &StackString::kSymLen);
      if (!bVar1) {
        i._0_1_ = 0;
      }
      pcVar3 = "";
      if (local_100 == 0) {
        pcVar3 = "\n";
      }
      snprintf(buf + local_fc,(long)(maxlen - local_fc),"%s\t@ %p %s\n",pcVar3,pcs[local_100],&i);
    }
    else {
      snprintf(buf + local_fc,(long)(maxlen - local_fc)," %p",pcs[local_100]);
    }
    sVar2 = strlen(buf + local_fc);
    local_fc = local_fc + (int)sVar2;
  }
  return buf;
}

Assistant:

static char *StackString(void **pcs, int n, char *buf, int maxlen,
                         bool symbolize) {
  static const int kSymLen = 200;
  char sym[kSymLen];
  int len = 0;
  for (int i = 0; i != n; i++) {
    if (symbolize) {
      if (!symbolizer(pcs[i], sym, kSymLen)) {
        sym[0] = '\0';
      }
      snprintf(buf + len, maxlen - len, "%s\t@ %p %s\n",
               (i == 0 ? "\n" : ""),
               pcs[i], sym);
    } else {
      snprintf(buf + len, maxlen - len, " %p", pcs[i]);
    }
    len += strlen(&buf[len]);
  }
  return buf;
}